

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O1

CURLcode cw_out_ptr_flush(cw_out_ctx *ctx,Curl_easy *data,cw_out_type otype,_Bool flush_all,
                         char *buf,size_t blen,size_t *pconsumed)

{
  int *piVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  curl_write_callback local_60;
  char *local_58;
  void *local_48;
  
  pcVar7 = (char *)CONCAT71(in_register_00000009,flush_all);
  if ((ctx->field_0x28 & 2) != 0) {
    return CURLE_WRITE_ERROR;
  }
  local_58 = (char *)0x4000;
  bVar3 = false;
  if (otype == CW_OUT_BODY) {
    lVar4 = 0x1e8;
LAB_00122c87:
    local_60 = (data->set).fwrite_func;
  }
  else {
    if (otype != CW_OUT_HDS) {
      local_60 = (curl_write_callback)0x0;
      local_48 = (void *)0x0;
      goto LAB_00122cb0;
    }
    local_60 = (data->set).fwrite_header;
    if (local_60 == (curl_write_callback)0x0) {
      bVar3 = true;
      lVar4 = 0x1f8;
      local_58 = (char *)0x0;
      if ((data->set).writeheader != (void *)0x0) goto LAB_00122c87;
      local_60 = (curl_write_callback)0x0;
    }
    else {
      bVar3 = true;
      lVar4 = 0x1f8;
      local_58 = (char *)0x0;
    }
  }
  local_48 = *(void **)((long)&data->magic + lVar4);
LAB_00122cb0:
  if (local_60 == (curl_write_callback)0x0) {
    *(char **)blen = buf;
  }
  else {
    *(undefined8 *)blen = 0;
    if (buf != (char *)0x0) {
      pcVar6 = "header";
      if (otype == CW_OUT_BODY) {
        pcVar6 = "body";
      }
      while ((ctx->field_0x28 & 1) == 0) {
        pcVar8 = local_58;
        if (buf < local_58) {
          pcVar8 = buf;
        }
        if (bVar3) {
          pcVar8 = buf;
        }
        Curl_set_in_callback(data,true);
        pcVar5 = (char *)(*local_60)(pcVar7,1,(size_t)pcVar8,local_48);
        Curl_set_in_callback(data,false);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) && (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write(data,"cw_out, wrote %zu %s bytes -> %zu",pcVar8,pcVar6,pcVar5);
        }
        if (pcVar5 == (char *)0xffffffff) {
          Curl_failf(data,"client returned ERROR on write of %zu bytes",pcVar8);
          return CURLE_WRITE_ERROR;
        }
        if (pcVar5 == (char *)0x10000001) {
          if ((data->conn != (connectdata *)0x0) && ((data->conn->handler->flags & 0x10) != 0)) {
            Curl_failf(data,"Write callback asked for PAUSE when not supported");
            return CURLE_WRITE_ERROR;
          }
          piVar1 = &(data->req).keepon;
          *(byte *)piVar1 = (byte)*piVar1 | 0x10;
          ctx->field_0x28 = ctx->field_0x28 | 1;
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_OK;
          }
          pcVar2 = (data->state).feat;
          if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
            return CURLE_OK;
          }
          if (0 < Curl_trc_feat_write.log_level) {
            Curl_trc_write(data,"cw_out, PAUSE requested by client");
            return CURLE_OK;
          }
          return CURLE_OK;
        }
        if (pcVar5 != pcVar8) {
          Curl_failf(data,"Failure writing output to destination, passed %zu returned %zd",pcVar8,
                     pcVar5);
          return CURLE_WRITE_ERROR;
        }
        *(char **)blen = pcVar5 + *(long *)blen;
        pcVar7 = pcVar7 + (long)pcVar5;
        buf = buf + -(long)pcVar5;
        if (buf == (char *)0x0) {
          return CURLE_OK;
        }
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cw_out_ptr_flush(struct cw_out_ctx *ctx,
                                 struct Curl_easy *data,
                                 cw_out_type otype,
                                 bool flush_all,
                                 const char *buf, size_t blen,
                                 size_t *pconsumed)
{
  curl_write_callback wcb;
  void *wcb_data;
  size_t max_write, min_write;
  size_t wlen, nwritten;

  /* If we errored once, we do not invoke the client callback  again */
  if(ctx->errored)
    return CURLE_WRITE_ERROR;

  /* write callbacks may get NULLed by the client between calls. */
  cw_get_writefunc(data, otype, &wcb, &wcb_data, &max_write, &min_write);
  if(!wcb) {
    *pconsumed = blen;
    return CURLE_OK;
  }

  *pconsumed = 0;
  while(blen && !ctx->paused) {
    if(!flush_all && blen < min_write)
      break;
    wlen = max_write ? CURLMIN(blen, max_write) : blen;
    Curl_set_in_callback(data, TRUE);
    nwritten = wcb((char *)buf, 1, wlen, wcb_data);
    Curl_set_in_callback(data, FALSE);
    CURL_TRC_WRITE(data, "cw_out, wrote %zu %s bytes -> %zu",
                   wlen, (otype == CW_OUT_BODY) ? "body" : "header",
                   nwritten);
    if(CURL_WRITEFUNC_PAUSE == nwritten) {
      if(data->conn && data->conn->handler->flags & PROTOPT_NONETWORK) {
        /* Protocols that work without network cannot be paused. This is
           actually only FILE:// just now, and it cannot pause since the
           transfer is not done using the "normal" procedure. */
        failf(data, "Write callback asked for PAUSE when not supported");
        return CURLE_WRITE_ERROR;
      }
      /* mark the connection as RECV paused */
      data->req.keepon |= KEEP_RECV_PAUSE;
      ctx->paused = TRUE;
      CURL_TRC_WRITE(data, "cw_out, PAUSE requested by client");
      break;
    }
    else if(CURL_WRITEFUNC_ERROR == nwritten) {
      failf(data, "client returned ERROR on write of %zu bytes", wlen);
      return CURLE_WRITE_ERROR;
    }
    else if(nwritten != wlen) {
      failf(data, "Failure writing output to destination, "
            "passed %zu returned %zd", wlen, nwritten);
      return CURLE_WRITE_ERROR;
    }
    *pconsumed += nwritten;
    blen -= nwritten;
    buf += nwritten;
  }
  return CURLE_OK;
}